

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O0

int rtr_bgpsec_prepend_sig_seg(rtr_bgpsec *bgpsec,rtr_signature_seg *new_seg)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  rtr_signature_seg *new_seg_local;
  rtr_bgpsec *bgpsec_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((new_seg != (rtr_signature_seg *)0x0) && (new_seg->signature != (uint8_t *)0x0)) &&
     (new_seg->sig_len != 0)) {
    iVar2 = ski_is_empty(new_seg->ski);
    if (iVar2 == 0) {
      if (bgpsec->sigs != (rtr_signature_seg *)0x0) {
        new_seg->next = bgpsec->sigs;
      }
      bgpsec->sigs = new_seg;
      bgpsec->sigs_len = bgpsec->sigs_len + 1;
      bgpsec_local._4_4_ = 0;
      goto LAB_0011b8f2;
    }
  }
  bgpsec_local._4_4_ = -1;
LAB_0011b8f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bgpsec_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

int rtr_bgpsec_prepend_sig_seg(struct rtr_bgpsec *bgpsec, struct rtr_signature_seg *new_seg)
{
	if (!new_seg || !new_seg->signature || !new_seg->sig_len || ski_is_empty(new_seg->ski))
		return RTR_BGPSEC_ERROR;

	if (bgpsec->sigs)
		new_seg->next = bgpsec->sigs;

	bgpsec->sigs = new_seg;
	bgpsec->sigs_len++;

	return RTR_BGPSEC_SUCCESS;
}